

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

DdNode * cuddBddLICompaction(DdManager *dd,DdNode *f,DdNode *c)

{
  int iVar1;
  st__table *table;
  st__table *psVar2;
  DdNode *zero;
  DdNode *res;
  st__table *buildcache;
  st__table *markcache;
  st__table *marktable;
  DdNode *c_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)((ulong)dd->one ^ 1);
  if ((DdManager *)c != dd_local) {
    table = st__init_table(st__ptrcmp,st__ptrhash);
    if (table == (st__table *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      psVar2 = st__init_table(MarkCacheCompare,MarkCacheHash);
      if (psVar2 == (st__table *)0x0) {
        st__free_table(table);
        dd_local = (DdManager *)0x0;
      }
      else {
        iVar1 = cuddBddLICMarkEdges(dd,f,c,table,psVar2);
        if (iVar1 == -1) {
          st__foreach(psVar2,MarkCacheCleanUp,(char *)0x0);
          st__free_table(table);
          st__free_table(psVar2);
          dd_local = (DdManager *)0x0;
        }
        else {
          st__foreach(psVar2,MarkCacheCleanUp,(char *)0x0);
          st__free_table(psVar2);
          psVar2 = st__init_table(st__ptrcmp,st__ptrhash);
          if (psVar2 == (st__table *)0x0) {
            st__free_table(table);
            dd_local = (DdManager *)0x0;
          }
          else {
            dd_local = (DdManager *)cuddBddLICBuildResult(dd,f,psVar2,table);
            st__free_table(psVar2);
            st__free_table(table);
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddBddLICompaction(
  DdManager * dd /* manager */,
  DdNode * f /* function to be minimized */,
  DdNode * c /* constraint (care set) */)
{
    st__table *marktable, *markcache, *buildcache;
    DdNode *res, *zero;

    zero = Cudd_Not(DD_ONE(dd));
    if (c == zero) return(zero);

    /* We need to use local caches for both steps of this operation.
    ** The results of the edge marking step are only valid as long as the
    ** edge markings themselves are available. However, the edge markings
    ** are lost at the end of one invocation of Cudd_bddLICompaction.
    ** Hence, the cache entries for the edge marking step must be
    ** invalidated at the end of this function.
    ** For the result of the building step we argue as follows. The result
    ** for a node and a given constrain depends on the BDD in which the node
    ** appears. Hence, the same node and constrain may give different results
    ** in successive invocations.
    */
    marktable = st__init_table( st__ptrcmp, st__ptrhash);
    if (marktable == NULL) {
        return(NULL);
    }
    markcache = st__init_table(MarkCacheCompare,MarkCacheHash);
    if (markcache == NULL) {
        st__free_table(marktable);
        return(NULL);
    }
    if (cuddBddLICMarkEdges(dd,f,c,marktable,markcache) == CUDD_OUT_OF_MEM) {
        st__foreach(markcache, MarkCacheCleanUp, NULL);
        st__free_table(marktable);
        st__free_table(markcache);
        return(NULL);
    }
    st__foreach(markcache, MarkCacheCleanUp, NULL);
    st__free_table(markcache);
    buildcache = st__init_table( st__ptrcmp, st__ptrhash);
    if (buildcache == NULL) {
        st__free_table(marktable);
        return(NULL);
    }
    res = cuddBddLICBuildResult(dd,f,buildcache,marktable);
    st__free_table(buildcache);
    st__free_table(marktable);
    return(res);

}